

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O0

void __thiscall
ThreeWiseHash<unsigned_long_long,_unsigned_char>::update
          (ThreeWiseHash<unsigned_long_long,_unsigned_char> *this,uchar param_1,uchar inchar)

{
  uchar local_12;
  uchar local_11;
  uchar inchar_local;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> *pTStack_10;
  uchar param_1_local;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> *this_local;
  
  local_12 = inchar;
  local_11 = param_1;
  pTStack_10 = this;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->ngram,&local_12);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->ngram);
  __updateHashValue(this);
  return;
}

Assistant:

void update(chartype, chartype inchar) {
    ngram.push_back(inchar);
    ngram.pop_front();
    __updateHashValue();
  }